

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example.cc
# Opt level: O1

void __thiscall TC_parser<true>::nameSpaceInfo(TC_parser<true> *this)

{
  byte bVar1;
  byte *_begin;
  uint64_t uVar2;
  long lVar3;
  byte *pbVar4;
  substring sVar5;
  v_array<char> base_v_array;
  char local_49;
  v_array<char> local_48;
  
  _begin = (byte *)this->reading_head;
  if (_begin != (byte *)this->endLine) {
    bVar1 = *_begin;
    if (((0x3a < bVar1) || ((0x400000100002200U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) &&
       (bVar1 != 0x7c)) {
      this->index = bVar1;
      if (this->redefine_some == true) {
        this->index = (*this->redefine)[bVar1];
      }
      if ((this->ae->super_example_predict).feature_space[this->index].values._end ==
          (this->ae->super_example_predict).feature_space[this->index].values._begin) {
        this->new_index = true;
      }
      lVar3 = 0;
      pbVar4 = _begin;
      while( true ) {
        bVar1 = *pbVar4;
        if ((((ulong)bVar1 < 0x3b) && ((0x400000100000200U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) ||
           ((bVar1 == 0x7c || ((pbVar4 == (byte *)this->endLine || (bVar1 == 0xd)))))) break;
        pbVar4 = pbVar4 + 1;
        this->reading_head = (char *)pbVar4;
        lVar3 = lVar3 + -1;
      }
      local_48.end_array = (char *)0x0;
      local_48.erase_count = 0;
      local_48._begin = (char *)0x0;
      local_48._end = (char *)0x0;
      push_many<char>(&local_48,(char *)_begin,-lVar3);
      local_49 = '\0';
      v_array<char>::push_back(&local_48,&local_49);
      if (this->base != (char *)0x0) {
        free(this->base);
      }
      this->base = local_48._begin;
      sVar5.end = (char *)pbVar4;
      sVar5.begin = (char *)_begin;
      uVar2 = (*this->p->hasher)(sVar5,(ulong)this->hash_seed);
      this->channel_hash = uVar2;
      nameSpaceInfoValue(this);
      return;
    }
  }
  parserWarning(this,"malformed example! String expected after : \"",this->beginLine,(char *)_begin,
                "\"");
  return;
}

Assistant:

inline void nameSpaceInfo()
  {
    if (reading_head == endLine || *reading_head == '|' || *reading_head == ' ' || *reading_head == '\t' ||
        *reading_head == ':' || *reading_head == '\r')
    {
      // syntax error
      parserWarning("malformed example! String expected after : \"", beginLine, reading_head, "\"");
    }
    else
    {
      // NameSpaceInfo --> 'String' NameSpaceInfoValue
      index = (unsigned char)(*reading_head);
      if (redefine_some)
        index = (*redefine)[index];  // redefine index
      if (ae->feature_space[index].size() == 0)
        new_index = true;
      substring name = read_name();
      if (audit)
      {
        v_array<char> base_v_array = v_init<char>();
        push_many(base_v_array, name.begin, name.end - name.begin);
        base_v_array.push_back('\0');
        if (base != nullptr)
          free(base);
        base = base_v_array.begin();
      }
      channel_hash = p->hasher(name, this->hash_seed);
      nameSpaceInfoValue();
    }
  }